

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::deinit
          (SamplerBindingRenderCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  
  LayoutBindingRenderCase::deinit(&this->super_LayoutBindingRenderCase);
  puVar2 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)puVar3 - (long)puVar2) >> 2)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      if (*(int *)((long)puVar2 + lVar4) != 0) {
        iVar1 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))
                  (1,(long)(this->m_textures).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar4);
        iVar1 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0xb8))(this->m_textureType,0);
        puVar2 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 < (int)((ulong)((long)puVar3 - (long)puVar2) >> 2));
  }
  return;
}

Assistant:

void SamplerBindingRenderCase::deinit(void)
{
	LayoutBindingRenderCase::deinit();

	// Clean up texture data
	for (int i = 0; i < (int)m_textures.size(); ++i)
	{
		if (m_textures[i])
		{
			m_context.getRenderContext().getFunctions().deleteTextures(1, &m_textures[i]);
			m_context.getRenderContext().getFunctions().bindTexture(m_textureType, 0);
		}
	}
}